

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O0

LogStream * __thiscall LogStream::operator<<(LogStream *this,char *str)

{
  size_t in_RSI;
  LogStream *in_RDI;
  FixedBuffer<4000> *unaff_retaddr;
  
  if (in_RSI == 0) {
    FixedBuffer<4000>::append(unaff_retaddr,(char *)in_RDI,0);
  }
  else {
    FixedBuffer<4000>::append(unaff_retaddr,(char *)in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

LogStream& operator<<(const char* str){
        if(str){
            buffer_.append(str, sizeof(str));
        }else {
            buffer_.append("(nullptr)", 9);
        }
        return *this;
    }